

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O0

void __thiscall leveldb::BlockBuilder::Add(BlockBuilder *this,Slice *key,Slice *value)

{
  Comparator *pCVar1;
  byte bVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  unsigned_long *puVar6;
  size_t sVar7;
  char *pcVar8;
  bool bVar9;
  Slice local_70;
  long local_60;
  size_t non_shared;
  size_t local_50;
  size_t local_48;
  ulong local_40;
  size_t min_length;
  size_t shared;
  Slice last_key_piece;
  Slice *value_local;
  Slice *key_local;
  BlockBuilder *this_local;
  
  last_key_piece.size_ = (size_t)value;
  Slice::Slice((Slice *)&shared,&this->last_key_);
  if (((this->finished_ ^ 0xffU) & 1) == 0) {
    __assert_fail("!finished_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/block_builder.cc"
                  ,0x4a,"void leveldb::BlockBuilder::Add(const Slice &, const Slice &)");
  }
  if (this->options_->block_restart_interval < this->counter_) {
    __assert_fail("counter_ <= options_->block_restart_interval",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/block_builder.cc"
                  ,0x4b,"void leveldb::BlockBuilder::Add(const Slice &, const Slice &)");
  }
  bVar2 = std::__cxx11::string::empty();
  bVar9 = true;
  if ((bVar2 & 1) == 0) {
    pCVar1 = this->options_->comparator;
    iVar5 = (*pCVar1->_vptr_Comparator[2])(pCVar1,key,&shared);
    bVar9 = 0 < iVar5;
  }
  if (!bVar9) {
    __assert_fail("buffer_.empty() || options_->comparator->Compare(key, last_key_piece) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/block_builder.cc"
                  ,0x4d,"void leveldb::BlockBuilder::Add(const Slice &, const Slice &)");
  }
  min_length = 0;
  if (this->counter_ < this->options_->block_restart_interval) {
    local_48 = Slice::size((Slice *)&shared);
    local_50 = Slice::size(key);
    puVar6 = std::min<unsigned_long>(&local_48,&local_50);
    local_40 = *puVar6;
    while( true ) {
      bVar9 = false;
      if (min_length < local_40) {
        cVar3 = Slice::operator[]((Slice *)&shared,min_length);
        cVar4 = Slice::operator[](key,min_length);
        bVar9 = cVar3 == cVar4;
      }
      if (!bVar9) break;
      min_length = min_length + 1;
    }
  }
  else {
    non_shared._4_4_ = std::__cxx11::string::size();
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->restarts_,(value_type_conflict1 *)((long)&non_shared + 4));
    this->counter_ = 0;
  }
  sVar7 = Slice::size(key);
  local_60 = sVar7 - min_length;
  PutVarint32(&this->buffer_,(uint32_t)min_length);
  PutVarint32(&this->buffer_,(uint32_t)local_60);
  sVar7 = Slice::size((Slice *)last_key_piece.size_);
  PutVarint32(&this->buffer_,(uint32_t)sVar7);
  pcVar8 = Slice::data(key);
  std::__cxx11::string::append((char *)&this->buffer_,(ulong)(pcVar8 + min_length));
  pcVar8 = Slice::data((Slice *)last_key_piece.size_);
  Slice::size((Slice *)last_key_piece.size_);
  std::__cxx11::string::append((char *)&this->buffer_,(ulong)pcVar8);
  std::__cxx11::string::resize((ulong)&this->last_key_);
  pcVar8 = Slice::data(key);
  std::__cxx11::string::append((char *)&this->last_key_,(ulong)(pcVar8 + min_length));
  Slice::Slice(&local_70,&this->last_key_);
  bVar9 = leveldb::operator==(&local_70,key);
  if (bVar9) {
    this->counter_ = this->counter_ + 1;
    return;
  }
  __assert_fail("Slice(last_key_) == key",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/block_builder.cc"
                ,0x68,"void leveldb::BlockBuilder::Add(const Slice &, const Slice &)");
}

Assistant:

void BlockBuilder::Add(const Slice& key, const Slice& value) {
  Slice last_key_piece(last_key_);
  assert(!finished_);
  assert(counter_ <= options_->block_restart_interval);
  assert(buffer_.empty()  // No values yet?
         || options_->comparator->Compare(key, last_key_piece) > 0);
  size_t shared = 0;
  if (counter_ < options_->block_restart_interval) {
    // See how much sharing to do with previous string
    const size_t min_length = std::min(last_key_piece.size(), key.size());
    while ((shared < min_length) && (last_key_piece[shared] == key[shared])) {
      shared++;
    }
  } else {
    // Restart compression
    restarts_.push_back(buffer_.size());
    counter_ = 0;
  }
  const size_t non_shared = key.size() - shared;

  // Add "<shared><non_shared><value_size>" to buffer_
  PutVarint32(&buffer_, shared);
  PutVarint32(&buffer_, non_shared);
  PutVarint32(&buffer_, value.size());

  // Add string delta to buffer_ followed by value
  buffer_.append(key.data() + shared, non_shared);
  buffer_.append(value.data(), value.size());

  // Update state
  last_key_.resize(shared);
  last_key_.append(key.data() + shared, non_shared);
  assert(Slice(last_key_) == key);
  counter_++;
}